

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

void ggml_set_f32_1d(ggml_tensor *tensor,int i,float value)

{
  ggml_type gVar1;
  char cVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar5 [64];
  int64_t id [4];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  auVar5._4_60_ = in_register_00001204;
  auVar5._0_4_ = value;
  cVar2 = ggml_is_contiguous();
  if (cVar2 == '\0') {
    local_38 = 0;
    uStack_30 = 0;
    uStack_28 = 0;
    uStack_20 = 0;
    ggml_unravel_index(tensor,(long)i,&local_38,&uStack_30,&uStack_28,&uStack_20);
    ggml_set_f32_nd(tensor,(int)local_38,(int)uStack_30,(int)uStack_28,(int)uStack_20,value);
  }
  else {
    gVar1 = tensor->type;
    switch(gVar1) {
    case GGML_TYPE_I8:
      *(char *)((long)tensor->data + (long)i) = (char)(int)value;
      break;
    case GGML_TYPE_I16:
      *(short *)((long)tensor->data + (long)i * 2) = (short)(int)value;
      break;
    case GGML_TYPE_I32:
      *(int *)((long)tensor->data + (long)i * 4) = (int)value;
      break;
    case GGML_TYPE_I64:
    case GGML_TYPE_F64:
    case GGML_TYPE_IQ1_M:
switchD_0010cfd0_caseD_1b:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x459,"fatal error");
    case GGML_TYPE_BF16:
      if ((uint)ABS(value) < 0x7f800001) {
        uVar3 = (ushort)((int)value + 0x7fff + ((uint)value >> 0x10 & 1) >> 0x10);
      }
      else {
        uVar3 = (ushort)((uint)value >> 0x10) | 0x40;
      }
      *(ushort *)((long)tensor->data + (long)i * 2) = uVar3;
      break;
    default:
      if (gVar1 == GGML_TYPE_F32) {
        *(float *)((long)tensor->data + (long)i * 4) = value;
      }
      else {
        if (gVar1 != GGML_TYPE_F16) goto switchD_0010cfd0_caseD_1b;
        auVar4 = vcvtps2ph_f16c(auVar5._0_16_,0);
        vpextrw_avx(auVar4,0);
      }
    }
  }
  return;
}

Assistant:

void ggml_set_f32_1d(const struct ggml_tensor * tensor, int i, float value) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        ggml_set_f32_nd(tensor, id[0], id[1], id[2], id[3], value);
        return;
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                ((ggml_bf16_t *)(tensor->data))[i] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                ((float *)(tensor->data))[i] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}